

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O1

void __thiscall InplaceSolverIslandCallback::processConstraints(InplaceSolverIslandCallback *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  btPersistentManifold **ppbVar5;
  btCollisionObject **ppbVar6;
  btTypedConstraint **ppbVar7;
  long lVar8;
  
  uVar1 = (this->m_bodies).m_size;
  ppbVar7 = (btTypedConstraint **)0x0;
  ppbVar6 = (btCollisionObject **)0x0;
  if (uVar1 != 0) {
    ppbVar6 = (this->m_bodies).m_data;
  }
  uVar2 = (this->m_manifolds).m_size;
  ppbVar5 = (btPersistentManifold **)0x0;
  if (uVar2 != 0) {
    ppbVar5 = (this->m_manifolds).m_data;
  }
  uVar3 = (this->m_constraints).m_size;
  if (uVar3 != 0) {
    ppbVar7 = (this->m_constraints).m_data;
  }
  (*this->m_solver->_vptr_btConstraintSolver[3])
            (this->m_solver,ppbVar6,(ulong)uVar1,ppbVar5,(ulong)uVar2,ppbVar7,(ulong)uVar3,
             this->m_solverInfo,this->m_debugDrawer,this->m_dispatcher);
  iVar4 = (this->m_bodies).m_size;
  lVar8 = (long)iVar4;
  if ((lVar8 < 1) && (iVar4 < 0)) {
    if ((this->m_bodies).m_capacity < 0) {
      ppbVar6 = (this->m_bodies).m_data;
      if (ppbVar6 != (btCollisionObject **)0x0) {
        if ((this->m_bodies).m_ownsMemory == true) {
          btAlignedFreeInternal(ppbVar6);
        }
        (this->m_bodies).m_data = (btCollisionObject **)0x0;
      }
      (this->m_bodies).m_ownsMemory = true;
      (this->m_bodies).m_data = (btCollisionObject **)0x0;
      (this->m_bodies).m_capacity = 0;
    }
    if (iVar4 < 0) {
      do {
        (this->m_bodies).m_data[lVar8] = (btCollisionObject *)0x0;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
  }
  (this->m_bodies).m_size = 0;
  iVar4 = (this->m_manifolds).m_size;
  lVar8 = (long)iVar4;
  if ((lVar8 < 1) && (iVar4 < 0)) {
    if ((this->m_manifolds).m_capacity < 0) {
      ppbVar5 = (this->m_manifolds).m_data;
      if (ppbVar5 != (btPersistentManifold **)0x0) {
        if ((this->m_manifolds).m_ownsMemory == true) {
          btAlignedFreeInternal(ppbVar5);
        }
        (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      }
      (this->m_manifolds).m_ownsMemory = true;
      (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      (this->m_manifolds).m_capacity = 0;
    }
    if (iVar4 < 0) {
      do {
        (this->m_manifolds).m_data[lVar8] = (btPersistentManifold *)0x0;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
  }
  (this->m_manifolds).m_size = 0;
  iVar4 = (this->m_constraints).m_size;
  lVar8 = (long)iVar4;
  if ((lVar8 < 1) && (iVar4 < 0)) {
    if ((this->m_constraints).m_capacity < 0) {
      ppbVar7 = (this->m_constraints).m_data;
      if (ppbVar7 != (btTypedConstraint **)0x0) {
        if ((this->m_constraints).m_ownsMemory == true) {
          btAlignedFreeInternal(ppbVar7);
        }
        (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      }
      (this->m_constraints).m_ownsMemory = true;
      (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      (this->m_constraints).m_capacity = 0;
    }
    if (iVar4 < 0) {
      do {
        (this->m_constraints).m_data[lVar8] = (btTypedConstraint *)0x0;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
  }
  (this->m_constraints).m_size = 0;
  return;
}

Assistant:

void	processConstraints()
	{

		btCollisionObject** bodies = m_bodies.size()? &m_bodies[0]:0;
		btPersistentManifold** manifold = m_manifolds.size()?&m_manifolds[0]:0;
		btTypedConstraint** constraints = m_constraints.size()?&m_constraints[0]:0;

		m_solver->solveGroup( bodies,m_bodies.size(),manifold, m_manifolds.size(),constraints, m_constraints.size() ,*m_solverInfo,m_debugDrawer,m_dispatcher);
		m_bodies.resize(0);
		m_manifolds.resize(0);
		m_constraints.resize(0);

	}